

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

DWARFUnit * __thiscall llvm::DWARFUnitVector::getUnitForIndexEntry(DWARFUnitVector *this,Entry *E)

{
  iterator puVar1;
  DWARFSectionKind __args_1;
  uint uVar2;
  DWARFUnit *pDVar3;
  undefined8 uVar4;
  SectionContribution *pSVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  iterator I;
  undefined8 local_38;
  
  pSVar5 = DWARFUnitIndex::Entry::getOffset(E,DW_SECT_INFO);
  if (pSVar5 != (SectionContribution *)0x0) {
    uVar2 = this->NumInfoUnits;
    if (this->NumInfoUnits == 0xffffffff) {
      uVar2 = (this->
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              ).
              super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              .
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
              .
              super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
              .super_SmallVectorBase.Size;
    }
    uVar8 = (ulong)uVar2;
    __args_1 = pSVar5->Offset;
    I = (iterator)
        (this->
        super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
        ).
        super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
        .
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        .
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.BeginX;
    puVar1 = I + uVar8;
    if (uVar2 != 0) {
      do {
        uVar7 = uVar8 >> 1;
        uVar2 = pSVar5->Offset;
        uVar6 = DWARFUnitHeader::getNextUnitOffset
                          (&(I[uVar7]._M_t.
                             super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                             .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl)->Header)
        ;
        if (uVar6 <= uVar2) {
          I = I + uVar7 + 1;
          uVar7 = ~uVar7 + uVar8;
        }
        uVar8 = uVar7;
      } while (0 < (long)uVar7);
    }
    if ((I != puVar1) &&
       (pDVar3 = (I->_M_t).
                 super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
                 super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
                 super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,
       (pDVar3->Header).Offset <= (ulong)__args_1)) {
      return pDVar3;
    }
    if ((this->Parser).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::
      function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
      ::operator()((function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
                    *)&stack0xffffffffffffffc8,(unsigned_long)&this->Parser,__args_1,
                   (DWARFSection *)0x1,(Entry *)0x0);
      uVar4 = local_38;
      SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>::
      insert((SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              *)this,I,
             (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
             &stack0xffffffffffffffc8);
      this->NumInfoUnits = this->NumInfoUnits + 1;
      if ((DWARFUnit *)local_38 == (DWARFUnit *)0x0) {
        return (DWARFUnit *)uVar4;
      }
      (**(code **)(*(long *)local_38 + 8))();
      return (DWARFUnit *)uVar4;
    }
  }
  return (DWARFUnit *)0x0;
}

Assistant:

DWARFUnit *
DWARFUnitVector::getUnitForIndexEntry(const DWARFUnitIndex::Entry &E) {
  const auto *CUOff = E.getOffset(DW_SECT_INFO);
  if (!CUOff)
    return nullptr;

  auto Offset = CUOff->Offset;
  auto end = begin() + getNumInfoUnits();

  auto *CU =
      std::upper_bound(begin(), end, CUOff->Offset,
                       [](uint64_t LHS, const std::unique_ptr<DWARFUnit> &RHS) {
                         return LHS < RHS->getNextUnitOffset();
                       });
  if (CU != end && (*CU)->getOffset() <= Offset)
    return CU->get();

  if (!Parser)
    return nullptr;

  auto U = Parser(Offset, DW_SECT_INFO, nullptr, &E);
  if (!U)
    U = nullptr;

  auto *NewCU = U.get();
  this->insert(CU, std::move(U));
  ++NumInfoUnits;
  return NewCU;
}